

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O1

PropStatus __thiscall spvtools::opt::CCPPass::VisitPhi(CCPPass *this,Instruction *phi)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  bool bVar3;
  uint32_t uVar4;
  PropStatus PVar5;
  __node_base_ptr p_Var6;
  mapped_type *pmVar7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  uint32_t i;
  __node_base_ptr p_Var10;
  mapped_type mVar11;
  mapped_type mVar12;
  bool bVar13;
  bool bVar14;
  uint32_t local_2c;
  
  bVar13 = 2 < (uint)((int)((ulong)((long)(phi->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(phi->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555);
  mVar11 = 0;
  if (bVar13) {
    mVar11 = 0;
    i = 2;
    do {
      bVar3 = SSAPropagator::IsPhiArgExecutable
                        ((this->propagator_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::SSAPropagator,_std::default_delete<spvtools::opt::SSAPropagator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::SSAPropagator_*,_std::default_delete<spvtools::opt::SSAPropagator>_>
                         .super__Head_base<0UL,_spvtools::opt::SSAPropagator_*,_false>._M_head_impl,
                         phi,i);
      if (bVar3) {
        uVar4 = Instruction::GetSingleWordOperand(phi,i);
        uVar1 = (this->values_)._M_h._M_bucket_count;
        uVar9 = (ulong)uVar4 % uVar1;
        p_Var2 = (this->values_)._M_h._M_buckets[uVar9];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var2 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var2, p_Var10 = p_Var2->_M_nxt,
           uVar4 != *(uint32_t *)&p_Var2->_M_nxt[1]._M_nxt)) {
          while (p_Var8 = p_Var10->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar1 != uVar9) ||
               (p_Var6 = p_Var10, p_Var10 = p_Var8, uVar4 == *(uint *)&p_Var8[1]._M_nxt))
            goto LAB_00536171;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_00536171:
        if (p_Var6 == (__node_base_ptr)0x0) {
          p_Var8 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var8 = p_Var6->_M_nxt;
        }
        bVar3 = false;
        mVar12 = mVar11;
        if (p_Var8 != (_Hash_node_base *)0x0) {
          mVar12 = *(mapped_type *)((long)&p_Var8[1]._M_nxt + 4);
          if (mVar12 == 0xffffffff) {
LAB_00536199:
            MarkInstructionVarying(this,phi);
            bVar3 = true;
            mVar12 = mVar11;
          }
          else if (mVar11 == 0) {
            bVar3 = false;
          }
          else {
            bVar14 = mVar12 != mVar11;
            mVar12 = mVar11;
            if (bVar14) goto LAB_00536199;
          }
        }
        mVar11 = mVar12;
        if (bVar3) break;
      }
      i = i + 2;
      bVar13 = i < (uint)((int)((ulong)((long)(phi->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(phi->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555);
    } while (bVar13);
  }
  PVar5 = kVarying;
  if (!bVar13) {
    if (mVar11 == 0) {
      PVar5 = kNotInteresting;
    }
    else {
      local_2c = 0;
      if (phi->has_result_id_ == true) {
        local_2c = Instruction::GetSingleWordOperand(phi,(uint)phi->has_type_id_);
      }
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->values_,&local_2c);
      *pmVar7 = mVar11;
      PVar5 = kInteresting;
    }
  }
  return PVar5;
}

Assistant:

SSAPropagator::PropStatus CCPPass::VisitPhi(Instruction* phi) {
  uint32_t meet_val_id = 0;

  // Implement the lattice meet operation. The result of this Phi instruction is
  // interesting only if the meet operation over arguments coming through
  // executable edges yields the same constant value.
  for (uint32_t i = 2; i < phi->NumOperands(); i += 2) {
    if (!propagator_->IsPhiArgExecutable(phi, i)) {
      // Ignore arguments coming through non-executable edges.
      continue;
    }
    uint32_t phi_arg_id = phi->GetSingleWordOperand(i);
    auto it = values_.find(phi_arg_id);
    if (it != values_.end()) {
      // We found an argument with a constant value.  Apply the meet operation
      // with the previous arguments.
      if (it->second == kVaryingSSAId) {
        // The "constant" value is actually a placeholder for varying. Return
        // varying for this phi.
        return MarkInstructionVarying(phi);
      } else if (meet_val_id == 0) {
        // This is the first argument we find.  Initialize the result to its
        // constant value id.
        meet_val_id = it->second;
      } else if (it->second == meet_val_id) {
        // The argument is the same constant value already computed. Continue
        // looking.
        continue;
      } else {
        // We either found a varying value, or another constant value different
        // from the previous computed meet value.  This Phi will never be
        // constant.
        return MarkInstructionVarying(phi);
      }
    } else {
      // The incoming value has no recorded value and is therefore not
      // interesting. A not interesting value joined with any other value is the
      // other value.
      continue;
    }
  }

  // If there are no incoming executable edges, the meet ID will still be 0. In
  // that case, return not interesting to evaluate the Phi node again.
  if (meet_val_id == 0) {
    return SSAPropagator::kNotInteresting;
  }

  // All the operands have the same constant value represented by |meet_val_id|.
  // Set the Phi's result to that value and declare it interesting.
  values_[phi->result_id()] = meet_val_id;
  return SSAPropagator::kInteresting;
}